

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O2

Error __thiscall
asmjit::CodeCompiler::_newReg
          (CodeCompiler *this,Reg *out,uint32_t typeId,char *nameFmt,__va_list_tag *ap)

{
  Error EVar1;
  StringBuilderTmp<256UL> sb;
  
  sb.super_StringBuilder._data = sb._embeddedData;
  sb._embeddedData[0] = '\0';
  sb.super_StringBuilder._length = 0;
  sb.super_StringBuilder._capacity = 0x100;
  sb.super_StringBuilder._canFree = 0;
  StringBuilder::_opVFormat(&sb.super_StringBuilder,1,nameFmt,ap);
  EVar1 = _newReg(this,out,typeId,sb.super_StringBuilder._data);
  StringBuilder::~StringBuilder(&sb.super_StringBuilder);
  return EVar1;
}

Assistant:

Error CodeCompiler::_newReg(Reg& out, uint32_t typeId, const char* nameFmt, va_list ap) {
  StringBuilderTmp<256> sb;
  sb.appendFormatVA(nameFmt, ap);
  return _newReg(out, typeId, sb.getData());
}